

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

void __thiscall
Selector::addListener
          (Selector *this,int fd,short events,SelectorListener *listener,jh_ptr_int_t private_data)

{
  ListenerNode *this_00;
  undefined1 local_58 [8];
  AutoLock l;
  ListenerNode *local_30;
  ListenerNode *node;
  jh_ptr_int_t private_data_local;
  SelectorListener *listener_local;
  short events_local;
  Selector *pSStack_10;
  int fd_local;
  Selector *this_local;
  
  node = (ListenerNode *)private_data;
  private_data_local = (jh_ptr_int_t)listener;
  listener_local._2_2_ = events;
  listener_local._4_4_ = fd;
  pSStack_10 = this;
  this_00 = (ListenerNode *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                         ,0x68);
  ListenerNode::ListenerNode(this_00);
  this_00->mFd = listener_local._4_4_;
  this_00->mEvents = listener_local._2_2_;
  this_00->mListener = (SelectorListener *)private_data_local;
  this_00->mPrivateData = (jh_ptr_int_t)node;
  local_30 = this_00;
  AutoLock::AutoLock((AutoLock *)local_58,&this->mLock);
  JetHead::list<Selector::ListenerNode_*>::push_back(&this->mList,&local_30);
  updateListeners(this);
  AutoLock::~AutoLock((AutoLock *)local_58);
  return;
}

Assistant:

void Selector::addListener( int fd, short events, SelectorListener *listener, jh_ptr_int_t private_data )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	ListenerNode *node = jh_new ListenerNode();
	
	node->mFd = fd;
	node->mEvents = events;
	node->mListener = listener;
	node->mPrivateData = private_data;
	
	AutoLock l( mLock );
	
	mList.push_back( node );	
	updateListeners();	
	
	LOG( "added fd %d events %x, list size %d", fd, events, mList.size() );
}